

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_get_lengths(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,size_t *base_size,
                  size_t *witness_size,size_t *witness_count,_Bool is_elements)

{
  uint uVar1;
  wally_tx_input *pwVar2;
  wally_tx_output *pwVar3;
  uint64_t uVar4;
  wally_tx_witness_stack *pwVar5;
  byte bVar6;
  _Bool _Var7;
  char cVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  size_t *psVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  char cVar18;
  uint64_t v;
  uint64_t uVar19;
  size_t sVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  
  if (opts == (tx_serialize_opts *)0x0) {
    *witness_count = 0;
    _Var7 = is_valid_tx(tx);
    if (!_Var7) {
      return -2;
    }
    bVar23 = false;
    bVar6 = 0;
    cVar18 = '\0';
    bVar24 = false;
LAB_001099b4:
    if (0xf < flags) {
      return -2;
    }
    bVar25 = true;
    if ((flags & 1) != 0) {
      iVar9 = wally_tx_get_witness_count(tx,witness_count);
      if (iVar9 != 0) {
        return -2;
      }
      bVar25 = *witness_count == 0;
    }
    sVar11 = 1;
    sVar10 = 1;
    if (bVar6 == 0) {
      sVar10 = tx->num_inputs;
    }
    sVar10 = varint_get_length(sVar10);
    if (!bVar23) {
      if (bVar24) {
        sVar11 = opts->index + 1;
      }
      else {
        sVar11 = tx->num_outputs;
      }
      sVar11 = varint_get_length(sVar11);
    }
    sVar10 = sVar11 + sVar10 + (ulong)(opts == (tx_serialize_opts *)0x0 && is_elements) +
                               (ulong)(opts != (tx_serialize_opts *)0x0) * 4 + 8;
    uVar17 = tx->num_inputs;
    if (uVar17 != 0) {
      lVar12 = 0x98;
      sVar11 = 0;
      do {
        pwVar2 = tx->inputs;
        if ((bVar6 == 0) || (sVar11 == opts->index)) {
          if ((pwVar2->txhash[lVar12 + -0x58] & 2) == 0) {
            lVar21 = sVar10 + 0x28;
          }
          else {
            sVar20 = confidential_value_length_from_bytes
                               (*(uchar **)(pwVar2->txhash + lVar12 + -0x10));
            sVar14 = confidential_value_length_from_bytes(*(uchar **)(pwVar2->txhash + lVar12));
            lVar21 = sVar14 + sVar10 + sVar20 + 0x68;
          }
          if (opts == (tx_serialize_opts *)0x0) {
            psVar13 = (size_t *)(pwVar2->txhash + lVar12 + -0x68);
LAB_00109b94:
            uVar19 = *psVar13;
            sVar10 = varint_get_length(uVar19);
            lVar22 = sVar10 + uVar19;
          }
          else {
            lVar22 = 1;
            psVar13 = &opts->script_len;
            if (sVar11 == opts->index) goto LAB_00109b94;
          }
          sVar10 = lVar22 + lVar21;
          uVar17 = tx->num_inputs;
        }
        sVar11 = sVar11 + 1;
        lVar12 = lVar12 + 0xd0;
      } while (sVar11 < uVar17);
    }
    if (!bVar23) {
      if (bVar24) {
        sVar11 = opts->index + 1;
      }
      else {
        sVar11 = tx->num_outputs;
      }
      if (sVar11 != 0) {
        lVar12 = 0x10;
        sVar20 = 0;
        do {
          pwVar3 = tx->outputs;
          if ((bVar24) && (sVar20 != opts->index)) {
            sVar10 = sVar10 + 9;
          }
          else {
            lVar21 = 8;
            if (is_elements) {
              cVar8 = cVar18;
              if ((*(byte *)((long)&pwVar3->script + lVar12) & 1) != 0) {
                sVar14 = confidential_asset_length_from_bytes
                                   (*(uchar **)((long)&pwVar3->script_len + lVar12));
                sVar15 = confidential_value_length_from_bytes
                                   (*(uchar **)((long)&pwVar3->asset + lVar12));
                sVar16 = confidential_nonce_length_from_bytes
                                   (*(uchar **)((long)&pwVar3->value + lVar12));
                lVar21 = sVar16 + sVar15 + sVar14;
              }
            }
            else {
              cVar8 = '\0';
            }
            uVar19 = *(uint64_t *)((long)&pwVar3->satoshi + lVar12);
            sVar14 = varint_get_length(uVar19);
            sVar10 = lVar21 + sVar10 + uVar19 + sVar14;
            if (cVar8 != '\0') {
              uVar19 = *(uint64_t *)((long)&pwVar3->surjectionproof_len + lVar12);
              sVar14 = varint_get_length(uVar19);
              uVar4 = *(uint64_t *)((long)&pwVar3->nonce_len + lVar12);
              sVar15 = varint_get_length(uVar4);
              sVar10 = sVar15 + uVar4 + sVar14 + uVar19 + sVar10;
            }
          }
          sVar20 = sVar20 + 1;
          lVar12 = lVar12 + 0x70;
        } while (sVar11 != sVar20);
      }
    }
    *base_size = sVar10;
    if ((flags & 1) != 0 && !bVar25) {
      if (is_elements) {
        sVar10 = 0;
        if (tx->num_inputs != 0) {
          uVar17 = 0;
          do {
            pwVar2 = tx->inputs;
            uVar19 = pwVar2[uVar17].issuance_amount_rangeproof_len;
            sVar11 = varint_get_length(uVar19);
            uVar4 = pwVar2[uVar17].inflation_keys_rangeproof_len;
            sVar20 = varint_get_length(uVar4);
            if (pwVar2[uVar17].witness == (wally_tx_witness_stack *)0x0) {
              v = 0;
            }
            else {
              v = (pwVar2[uVar17].witness)->num_items;
            }
            sVar14 = varint_get_length(v);
            lVar12 = uVar4 + sVar20 + uVar19 + sVar10 + sVar11 + sVar14;
            if (v != 0) {
              lVar21 = 8;
              do {
                uVar19 = *(uint64_t *)((long)&(pwVar2[uVar17].witness)->items->witness + lVar21);
                sVar10 = varint_get_length(uVar19);
                lVar12 = lVar12 + uVar19 + sVar10;
                lVar21 = lVar21 + 0x10;
                v = v - 1;
              } while (v != 0);
            }
            if (pwVar2[uVar17].pegin_witness == (wally_tx_witness_stack *)0x0) {
              sVar10 = varint_get_length(0);
              sVar10 = sVar10 + lVar12;
            }
            else {
              uVar19 = (pwVar2[uVar17].pegin_witness)->num_items;
              sVar10 = varint_get_length(uVar19);
              sVar10 = sVar10 + lVar12;
              if (uVar19 != 0) {
                lVar12 = 8;
                do {
                  uVar4 = *(uint64_t *)
                           ((long)&(pwVar2[uVar17].pegin_witness)->items->witness + lVar12);
                  sVar11 = varint_get_length(uVar4);
                  sVar10 = sVar10 + uVar4 + sVar11;
                  lVar12 = lVar12 + 0x10;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < tx->num_inputs);
        }
        if (tx->num_outputs != 0) {
          lVar12 = 0x68;
          uVar17 = 0;
          do {
            pwVar3 = tx->outputs;
            uVar19 = *(uint64_t *)((long)pwVar3 + lVar12 + -0x10);
            sVar11 = varint_get_length(uVar19);
            uVar4 = *(uint64_t *)((long)&pwVar3->satoshi + lVar12);
            sVar20 = varint_get_length(uVar4);
            sVar10 = sVar10 + uVar19 + sVar11 + sVar20 + uVar4;
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x70;
          } while (uVar17 < tx->num_outputs);
        }
      }
      else if (tx->num_inputs == 0) {
        sVar10 = 2;
      }
      else {
        sVar10 = 2;
        uVar17 = 0;
        do {
          pwVar2 = tx->inputs;
          pwVar5 = pwVar2[uVar17].witness;
          if (pwVar5 == (wally_tx_witness_stack *)0x0) {
            sVar11 = varint_get_length(0);
            sVar10 = sVar11 + sVar10;
          }
          else {
            uVar19 = pwVar5->num_items;
            sVar11 = varint_get_length(uVar19);
            sVar10 = sVar11 + sVar10;
            if (uVar19 != 0) {
              lVar12 = 8;
              do {
                uVar4 = *(uint64_t *)((long)&(pwVar2[uVar17].witness)->items->witness + lVar12);
                sVar11 = varint_get_length(uVar4);
                sVar10 = sVar10 + uVar4 + sVar11;
                lVar12 = lVar12 + 0x10;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < tx->num_inputs);
      }
      goto LAB_00109d06;
    }
  }
  else {
    uVar1 = opts->sighash;
    bVar23 = (uVar1 & 0x1f) == 2;
    bVar24 = (uVar1 & 0x1f) == 3;
    *witness_count = 0;
    _Var7 = is_valid_tx(tx);
    if (!_Var7) {
      return -2;
    }
    if ((flags & 1) != 0) {
      return -1;
    }
    if (opts->bip143 != true) {
      bVar6 = (byte)(uVar1 >> 7) & 1;
      cVar18 = (char)((uVar1 & 0x40) >> 6);
      goto LAB_001099b4;
    }
    uVar19 = opts->script_len;
    sVar10 = varint_get_length(uVar19);
    if (is_elements) {
      sVar11 = confidential_value_length_from_bytes(opts->value);
      lVar12 = sVar11 + 0x20;
      uVar17 = (ulong)((uVar1 & 0x40) >> 1);
    }
    else {
      lVar12 = 8;
      uVar17 = 0;
    }
    *base_size = lVar12 + uVar19 + sVar10 + uVar17 + 0x94;
    if ((tx->inputs[opts->index].features & 2) != 0) {
      sVar10 = confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount);
      sVar11 = confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
      *base_size = sVar11 + sVar10 + *base_size + 0x40;
    }
  }
  sVar10 = 0;
LAB_00109d06:
  *witness_size = sVar10;
  return 0;
}

Assistant:

static int tx_get_lengths(const struct wally_tx *tx,
                          const struct tx_serialize_opts *opts, uint32_t flags,
                          size_t *base_size, size_t *witness_size,
                          size_t *witness_count, bool is_elements)
{
    size_t n, i, j;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;

    *witness_count = 0;

    if (!is_valid_tx(tx))
        return WALLY_EINVAL;

    if (opts) {
        if (flags & WALLY_TX_FLAG_USE_WITNESS)
            return WALLY_ERROR; /* Segwit tx hashing uses bip143 opts member */

        if (opts->bip143) {
            *base_size = sizeof(uint32_t) + /* version */
                         SHA256_LEN + /* hash prevouts */
                         SHA256_LEN + /* hash sequence */
                         WALLY_TXHASH_LEN + sizeof(uint32_t) + /* outpoint + index */
                         varbuff_get_length(opts->script_len) + /* script */
                         (is_elements ? confidential_value_length_from_bytes(opts->value) + SHA256_LEN :
                          sizeof(uint64_t)) + /* amount */
                         sizeof(uint32_t) + /* input sequence */
                         SHA256_LEN + /* hash outputs */
                         ((is_elements && sh_rangeproof) ? SHA256_LEN : 0) + /* rangeproof */
                         sizeof(uint32_t) + /* nlocktime */
                         sizeof(uint32_t); /* tx sighash */
#ifdef BUILD_ELEMENTS
            if (tx->inputs[opts->index].features & WALLY_TX_IS_ISSUANCE)
                *base_size += 2 * WALLY_TX_ASSET_TAG_LEN +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount) +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
#endif
            *witness_size = 0;
            return WALLY_OK;
        }
    }

    if ((flags & ~WALLY_TX_ALL_FLAGS) ||
        ((flags & WALLY_TX_FLAG_USE_WITNESS) &&
         wally_tx_get_witness_count(tx, witness_count) != WALLY_OK))
        return WALLY_EINVAL;

    if (!*witness_count)
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;

    n = sizeof(tx->version) +
        varint_get_length(anyonecanpay ? 1 : tx->num_inputs) +
        (sh_none ? 1 : varint_get_length(sh_single ? opts->index + 1 : tx->num_outputs)) +
        sizeof(tx->locktime) +
        (opts ? sizeof(leint32_t) : 0); /* Include trailing tx_sighash */

    if (!opts && is_elements)
        n += sizeof(uint8_t); /* witness flag */
    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        n += sizeof(input->txhash) +
             sizeof(input->index) +
             sizeof(input->sequence);

#ifdef BUILD_ELEMENTS
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            n += sizeof(input->blinding_nonce) +
                 sizeof(input->entropy) +
                 confidential_value_length_from_bytes(input->issuance_amount) +
                 confidential_value_length_from_bytes(input->inflation_keys);
        }
#endif

        if (opts) {
            if (i == opts->index)
                n += varbuff_get_length(opts->script_len);
            else
                ++n;
        } else
            n += varbuff_get_length(input->script_len);

    }

    if (!sh_none) {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index)
                n += sizeof(EMPTY_OUTPUT);
            else {
                if (is_elements && (output->features & WALLY_TX_IS_ELEMENTS)) {
#ifdef BUILD_ELEMENTS
                    n += confidential_asset_length_from_bytes(output->asset) +
                         confidential_value_length_from_bytes(output->value) +
                         confidential_nonce_length_from_bytes(output->nonce);
#endif
                } else
                    n += sizeof(output->satoshi);
                n += varbuff_get_length(output->script_len);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    n += varbuff_get_length(output->rangeproof_len) +
                         varbuff_get_length(output->surjectionproof_len);
                }
#endif /* BUILD_ELEMENTS */
            }
        }
    }

    *base_size = n;

    n = 0;
    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (is_elements) {
#ifdef BUILD_ELEMENTS
            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items;
                n += varbuff_get_length(input->issuance_amount_rangeproof_len);
                n += varbuff_get_length(input->inflation_keys_rangeproof_len);
                num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
                num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->pegin_witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }

            for (i = 0; i < tx->num_outputs; ++i) {
                const struct wally_tx_output *output = tx->outputs + i;
                n += varbuff_get_length(output->surjectionproof_len);
                n += varbuff_get_length(output->rangeproof_len);
            }
#endif /* BUILD_ELEMENTS */
        } else {
            n = 2; /* For marker and flag bytes 0x00 0x01 */

            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }
        }
    }

    *witness_size = n;
    return WALLY_OK;
}